

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

int vkt::ssbo::anon_unknown_15::getUnsizedArrayStride(BufferLayout *layout,BlockLayoutEntry *entry)

{
  bool bVar1;
  reference piVar2;
  const_reference pvVar3;
  BufferVarLayoutEntry *varEntry;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  const_iterator varNdx;
  BlockLayoutEntry *entry_local;
  BufferLayout *layout_local;
  
  varNdx._M_current = (int *)entry;
  local_28._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&entry->activeVarIndices);
  while( true ) {
    varEntry = (BufferVarLayoutEntry *)
               std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)(varNdx._M_current + 10));
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &varEntry);
    if (!bVar1) {
      return 0;
    }
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_28);
    pvVar3 = std::
             vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
             ::operator[](&layout->bufferVars,(long)*piVar2);
    if (pvVar3->arraySize == 0) break;
    if (pvVar3->topLevelArraySize == 0) {
      return pvVar3->topLevelArrayStride;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_28);
  }
  return pvVar3->arrayStride;
}

Assistant:

static int getUnsizedArrayStride (const BufferLayout& layout, const BlockLayoutEntry& entry)
{
	for (vector<int>::const_iterator varNdx = entry.activeVarIndices.begin(); varNdx != entry.activeVarIndices.end(); ++varNdx)
	{
		const BufferVarLayoutEntry& varEntry = layout.bufferVars[*varNdx];

		if (varEntry.arraySize == 0)
			return varEntry.arrayStride;
		else if (varEntry.topLevelArraySize == 0)
			return varEntry.topLevelArrayStride;
	}

	return 0;
}